

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::anon_unknown_0::Disassembler::HandleHeader
          (Disassembler *this,spv_endianness_t endian,uint32_t version,uint32_t generator,
          uint32_t id_bound,uint32_t schema)

{
  InstructionDisassembler *this_00;
  spv_result_t in_EAX;
  spv_result_t extraout_EAX;
  
  this->endian_ = endian;
  if (this->header_ == true) {
    this_00 = &this->instruction_disassembler_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->instruction_disassembler_).stream_,"; SPIR-V\n",9);
    disassemble::InstructionDisassembler::EmitHeaderVersion(this_00,version);
    disassemble::InstructionDisassembler::EmitHeaderGenerator(this_00,generator);
    disassemble::InstructionDisassembler::EmitHeaderIdBound(this_00,id_bound);
    disassemble::InstructionDisassembler::EmitHeaderSchema(this_00,schema);
    in_EAX = extraout_EAX;
  }
  this->byte_offset_ = 0x14;
  return in_EAX;
}

Assistant:

spv_result_t Disassembler::HandleHeader(spv_endianness_t endian,
                                        uint32_t version, uint32_t generator,
                                        uint32_t id_bound, uint32_t schema) {
  endian_ = endian;

  if (header_) {
    instruction_disassembler_.EmitHeaderSpirv();
    instruction_disassembler_.EmitHeaderVersion(version);
    instruction_disassembler_.EmitHeaderGenerator(generator);
    instruction_disassembler_.EmitHeaderIdBound(id_bound);
    instruction_disassembler_.EmitHeaderSchema(schema);
  }

  byte_offset_ = SPV_INDEX_INSTRUCTION * sizeof(uint32_t);

  return SPV_SUCCESS;
}